

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::NotifyDataSourceStoppedRequest::NotifyDataSourceStoppedRequest
          (NotifyDataSourceStoppedRequest *this)

{
  NotifyDataSourceStoppedRequest *this_local;
  
  protozero::CppMessageObj::CppMessageObj(&this->super_CppMessageObj);
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__NotifyDataSourceStoppedRequest_009c33d0;
  this->data_source_id_ = 0;
  ::std::__cxx11::string::string((string *)&this->unknown_fields_);
  std::bitset<2UL>::bitset(&this->_has_field_);
  return;
}

Assistant:

NotifyDataSourceStoppedRequest::NotifyDataSourceStoppedRequest() = default;